

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3f0c0::JSONParser::JSONParser(JSONParser *this,InputSource *is,Reactor *reactor)

{
  Reactor *reactor_local;
  InputSource *is_local;
  JSONParser *this_local;
  
  this->is = is;
  this->reactor = reactor;
  this->lex_state = ls_top;
  this->bytes = 0;
  this->p = this->buf;
  this->u_count = 0;
  this->u_value = 0;
  this->offset = 0;
  this->done = false;
  std::__cxx11::string::string((string *)&this->token);
  this->token_start = 0;
  this->parser_state = ps_top;
  std::
  vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  ::vector(&this->stack);
  std::__cxx11::string::string((string *)&this->dict_key);
  this->dict_key_offset = 0;
  return;
}

Assistant:

JSONParser(InputSource& is, JSON::Reactor* reactor) :
            is(is),
            reactor(reactor),
            p(buf)
        {
        }